

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::Fence>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  Resources *this;
  Parameters *params_00;
  RefData<vk::Handle<(vk::HandleType)6>_> data;
  RefData<vk::Handle<(vk::HandleType)6>_> data_00;
  RefData<vk::Handle<(vk::HandleType)6>_> data_01;
  RefData<vk::Handle<(vk::HandleType)6>_> data_02;
  allocator<char> local_211;
  string local_210;
  Move<vk::Handle<(vk::HandleType)6>_> local_1f0;
  RefData<vk::Handle<(vk::HandleType)6>_> local_1d0;
  undefined1 local_1b0 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> obj3;
  RefData<vk::Handle<(vk::HandleType)6>_> local_170;
  undefined1 local_150 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> obj2;
  RefData<vk::Handle<(vk::HandleType)6>_> local_110;
  undefined1 local_f0 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> obj1;
  Move<vk::Handle<(vk::HandleType)6>_> local_c0;
  RefData<vk::Handle<(vk::HandleType)6>_> local_a0;
  undefined1 local_80 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> obj0;
  undefined1 local_58 [4];
  Resources res3;
  Resources res2;
  Resources res1;
  Resources res0;
  Environment env;
  Context *context_local;
  TestStatus *pTStack_10;
  Parameters params_local;
  
  context_local._4_4_ = params.flags;
  pTStack_10 = __return_storage_ptr__;
  Environment::Environment((Environment *)local_58,context,1);
  this = (Resources *)
         ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator + 7);
  params_00 = (Parameters *)((long)&context_local + 4);
  Fence::Resources::Resources(this,(Environment *)local_58,params_00);
  Fence::Resources::Resources
            ((Resources *)
             ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator +
             6),(Environment *)local_58,params_00);
  Fence::Resources::Resources
            ((Resources *)
             ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator +
             5),(Environment *)local_58,params_00);
  Fence::Resources::Resources
            ((Resources *)
             ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator +
             4),(Environment *)local_58,params_00);
  Fence::create(&local_c0,(Environment *)local_58,this,params_00);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a0,(Move *)&local_c0);
  data.deleter.m_deviceIface = local_a0.deleter.m_deviceIface;
  data.object.m_internal = local_a0.object.m_internal;
  data.deleter.m_device = local_a0.deleter.m_device;
  data.deleter.m_allocator = local_a0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_80,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_c0);
  Fence::create((Move<vk::Handle<(vk::HandleType)6>_> *)
                &obj2.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator,
                (Environment *)local_58,
                (Resources *)
                ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                        m_allocator + 6),(Parameters *)((long)&context_local + 4));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_110,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator)
  ;
  data_00.deleter.m_deviceIface = local_110.deleter.m_deviceIface;
  data_00.object.m_internal = local_110.object.m_internal;
  data_00.deleter.m_device = local_110.deleter.m_device;
  data_00.deleter.m_allocator = local_110.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_f0,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator);
  Fence::create((Move<vk::Handle<(vk::HandleType)6>_> *)
                &obj3.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator,
                (Environment *)local_58,
                (Resources *)
                ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                        m_allocator + 5),(Parameters *)((long)&context_local + 4));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_170,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator)
  ;
  data_01.deleter.m_deviceIface = local_170.deleter.m_deviceIface;
  data_01.object.m_internal = local_170.object.m_internal;
  data_01.deleter.m_device = local_170.deleter.m_device;
  data_01.deleter.m_allocator = local_170.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_150,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator);
  Fence::create(&local_1f0,(Environment *)local_58,
                (Resources *)
                ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                        m_allocator + 4),(Parameters *)((long)&context_local + 4));
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1d0,(Move *)&local_1f0);
  data_02.deleter.m_deviceIface = local_1d0.deleter.m_deviceIface;
  data_02.object.m_internal = local_1d0.object.m_internal;
  data_02.deleter.m_device = local_1d0.deleter.m_device;
  data_02.deleter.m_allocator = local_1d0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_1b0,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_1f0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_1b0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_150);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_f0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"Ok",&local_211);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}